

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smodels.cpp
# Opt level: O3

bool __thiscall Potassco::SmodelsInput::readCompute(SmodelsInput *this,char *comp,bool val)

{
  bool bVar1;
  char cVar2;
  BufferedStream *pBVar3;
  uint local_5c;
  uint *local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  pBVar3 = ProgramReader::stream(&this->super_ProgramReader);
  BufferedStream::skipWs(pBVar3);
  bVar1 = BufferedStream::match(pBVar3,comp);
  if (bVar1) {
    pBVar3 = ProgramReader::stream(&this->super_ProgramReader);
    cVar2 = BufferedStream::get(pBVar3);
    bVar1 = cVar2 == '\n';
  }
  else {
    bVar1 = false;
  }
  ProgramReader::require(&this->super_ProgramReader,bVar1,"compute statement expected");
  local_5c = ProgramReader::matchPos
                       (&this->super_ProgramReader,0xffffffff,"unsigned integer expected");
  if (local_5c != 0) {
    do {
      if (val) {
        local_5c = -local_5c;
      }
      local_48 = 0;
      uStack_40 = 0;
      local_50 = 1;
      local_58 = &local_5c;
      (*this->out_->_vptr_AbstractProgram[4])(this->out_,0,&local_48,&local_58);
      local_5c = ProgramReader::matchPos
                           (&this->super_ProgramReader,0xffffffff,"unsigned integer expected");
    } while (local_5c != 0);
  }
  return true;
}

Assistant:

bool SmodelsInput::readCompute(const char* comp, bool val) {
	require(match(comp) && stream()->get() == '\n', "compute statement expected");
	for (Lit_t x; (x = (Lit_t)matchPos()) != 0;) {
		if (val) { x = neg(x); }
		out_.rule(Head_t::Disjunctive, toSpan<Atom_t>(), toSpan(&x, 1));
	}
	return true;
}